

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O0

uint32 google::protobuf::Bits::Log2FloorNonZero(uint32 n)

{
  uint32 uVar1;
  uint32 n_local;
  
  uVar1 = 0x1f;
  if (n != 0) {
    for (; n >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  return uVar1;
}

Assistant:

static uint32 Log2FloorNonZero(uint32 n) {
#if defined(__GNUC__)
  return 31 ^ __builtin_clz(n);
#elif defined(COMPILER_MSVC) && defined(_M_IX86)
  _asm {
    bsr ebx, n
    mov n, ebx
  }
  return n;
#else
  return Log2FloorNonZero_Portable(n);
#endif
  }